

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O3

void nni_posix_pollq_sysfini(void)

{
  int iVar1;
  ssize_t sVar2;
  nni_mtx *mtx;
  long lVar3;
  nni_posix_pollq *ptr;
  long lVar4;
  undefined8 local_38;
  
  if (0 < nni_epoll_npq) {
    lVar3 = 0x70;
    lVar4 = 0;
    ptr = nni_epoll_pqs;
    iVar1 = nni_epoll_npq;
    do {
      local_38 = 1;
      if (*(char *)((long)ptr + lVar3 + -7) == '\x01') {
        mtx = (nni_mtx *)((long)ptr + lVar3 + -0x70);
        nni_mtx_lock(mtx);
        *(undefined1 *)((long)ptr + lVar3 + -8) = 1;
        sVar2 = write(*(int *)((long)ptr + lVar3 + -0xc),&local_38,8);
        if (sVar2 != 8) {
          nni_panic("BUG! unable to write to evfd!");
        }
        nni_mtx_unlock(mtx);
        nni_thr_fini((nni_thr *)((long)&(ptr->mtx).mtx + lVar3));
        close(*(int *)((long)ptr + lVar3 + -0xc));
        close(*(int *)((long)ptr + lVar3 + -0x10));
        nni_mtx_fini(mtx);
        ptr = nni_epoll_pqs;
        iVar1 = nni_epoll_npq;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x120;
    } while (lVar4 < iVar1);
    nni_free(ptr,(long)iVar1 * 0x120);
    nni_epoll_pqs = (nni_posix_pollq *)0x0;
    nni_epoll_npq = 0;
  }
  return;
}

Assistant:

void
nni_posix_pollq_sysfini(void)
{
	if (nni_epoll_npq > 0) {
		for (int i = 0; i < nni_epoll_npq; i++) {
			nni_epoll_pq_destroy(&nni_epoll_pqs[i]);
		}
		NNI_FREE_STRUCTS(nni_epoll_pqs, nni_epoll_npq);
		nni_epoll_pqs = NULL;
		nni_epoll_npq = 0;
	}
}